

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed.c
# Opt level: O0

void free_feed(feed_t *feed)

{
  feed_t *feed_local;
  
  if (0 < feed->agency_count) {
    free(feed->agencies);
  }
  if (0 < feed->calendar_dates_count) {
    free(feed->calendar_dates);
  }
  if (0 < feed->calendar_records_count) {
    free(feed->calendar_records);
  }
  if (0 < feed->fare_attributes_count) {
    free(feed->fare_attributes);
  }
  if (0 < feed->fare_rules_count) {
    free(feed->fare_rules);
  }
  if (0 < feed->feed_info_count) {
    free(feed->feed_info);
  }
  if (0 < feed->frequencies_count) {
    free(feed->frequencies);
  }
  if (0 < feed->levels_count) {
    free(feed->levels);
  }
  if (0 < feed->pathways_count) {
    free(feed->pathways);
  }
  if (0 < feed->routes_count) {
    free(feed->routes);
  }
  if (0 < feed->shapes_count) {
    free(feed->shapes);
  }
  if (0 < feed->stop_times_count) {
    free(feed->stop_times);
  }
  if (0 < feed->stops_count) {
    free(feed->stops);
  }
  if (0 < feed->transfers_count) {
    free(feed->transfers);
  }
  if (0 < feed->trips_count) {
    free(feed->trips);
  }
  return;
}

Assistant:

void free_feed(feed_t *feed) {
    if (feed->agency_count > 0) {
        free(feed->agencies);
    }
    if (feed->calendar_dates_count > 0) {
        free(feed->calendar_dates);
    }
    if (feed->calendar_records_count > 0) {
        free(feed->calendar_records);
    }
    if (feed->fare_attributes_count > 0) {
        free(feed->fare_attributes);
    }
    if (feed->fare_rules_count > 0) {
        free(feed->fare_rules);
    }
    if (feed->feed_info_count > 0) {
        free(feed->feed_info);
    }
    if (feed->frequencies_count > 0) {
        free(feed->frequencies);
    }
    if (feed->levels_count > 0) {
        free(feed->levels);
    }
    if (feed->pathways_count > 0) {
        free(feed->pathways);
    }
    if (feed->routes_count > 0) {
        free(feed->routes);
    }
    if (feed->shapes_count > 0) {
        free(feed->shapes);
    }
    if (feed->stop_times_count > 0) {
        free(feed->stop_times);
    }
    if (feed->stops_count > 0) {
        free(feed->stops);
    }
    if (feed->transfers_count > 0) {
        free(feed->transfers);
    }
    if (feed->trips_count > 0) {
        free(feed->trips);
    }
}